

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O1

void __thiscall despot::ParticleBelief::~ParticleBelief(ParticleBelief *this)

{
  DSPOMDP *pDVar1;
  pointer ppSVar2;
  ulong uVar3;
  
  (this->super_Belief)._vptr_Belief = (_func_int **)&PTR__ParticleBelief_00190128;
  ppSVar2 = (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppSVar2) {
    uVar3 = 0;
    do {
      pDVar1 = (this->super_Belief).model_;
      (*pDVar1->_vptr_DSPOMDP[0x17])(pDVar1,ppSVar2[uVar3]);
      uVar3 = uVar3 + 1;
      ppSVar2 = (this->particles_).
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->particles_).
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3))
    ;
  }
  ppSVar2 = (this->initial_particles_).
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->initial_particles_).
      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar2) {
    uVar3 = 0;
    do {
      pDVar1 = (this->super_Belief).model_;
      (*pDVar1->_vptr_DSPOMDP[0x17])(pDVar1,ppSVar2[uVar3]);
      uVar3 = uVar3 + 1;
      ppSVar2 = (this->initial_particles_).
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->initial_particles_).
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3))
    ;
  }
  if (ppSVar2 != (pointer)0x0) {
    operator_delete(ppSVar2,(long)(this->initial_particles_).
                                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar2
                   );
  }
  ppSVar2 = (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar2 != (pointer)0x0) {
    operator_delete(ppSVar2,(long)(this->particles_).
                                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar2
                   );
  }
  Belief::~Belief(&this->super_Belief);
  return;
}

Assistant:

ParticleBelief::~ParticleBelief() {
	for (int i = 0; i < particles_.size(); i++) {
		model_->Free(particles_[i]);
	}

	for (int i = 0; i < initial_particles_.size(); i++) {
		model_->Free(initial_particles_[i]);
	}
}